

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O3

ConversionResult
convertUTF::ConvertUTF16toUTF8
          (UTF16 **sourceStart,UTF16 *sourceEnd,UTF8 **targetStart,UTF8 *targetEnd,
          ConversionFlags flags)

{
  ushort uVar1;
  ushort *puVar2;
  UTF8 *pUVar3;
  ConversionResult CVar4;
  uint uVar5;
  ushort uVar6;
  
  puVar2 = *sourceStart;
  pUVar3 = *targetStart;
  CVar4 = conversionOK;
  if (sourceEnd <= puVar2) goto LAB_00181e10;
  uVar6 = *puVar2;
  uVar5 = (uint)uVar6;
  if ((uVar6 & 0xfc00) == 0xd800) {
    if (sourceEnd <= puVar2 + 1) {
      CVar4 = sourceExhausted;
      goto LAB_00181e10;
    }
    uVar1 = puVar2[1];
    if ((uVar1 & 0xfc00) == 0xdc00) {
      uVar5 = (uint)uVar6 * 0x400 + (uint)uVar1 + 0xfca02400;
    }
    else if (flags == strictConversion) goto LAB_00181e04;
  }
  else if ((flags == strictConversion) && ((uVar6 & 0xfc00) == 0xdc00)) {
LAB_00181e04:
    CVar4 = sourceIllegal;
    goto LAB_00181e10;
  }
  uVar6 = 1;
  if ((0x7f < uVar5) && (uVar6 = 2, 0x7ff < uVar5)) {
    uVar6 = 4 - (uVar5 < 0x10000);
  }
  if (pUVar3 + uVar6 <= targetEnd) {
    CVar4 = (*(code *)((long)&DAT_00204e50 + (long)(int)(&DAT_00204e50)[uVar6 - 1]))();
    return CVar4;
  }
  CVar4 = targetExhausted;
LAB_00181e10:
  *sourceStart = puVar2;
  *targetStart = pUVar3;
  return CVar4;
}

Assistant:

ConversionResult ConvertUTF16toUTF8(const UTF16** sourceStart, const UTF16* sourceEnd, UTF8** targetStart,
                                    const UTF8* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF16* source = *sourceStart;
    UTF8* target = *targetStart;
    while (source < sourceEnd)
    {
        unsigned short bytesToWrite;
        static constexpr UTF32 byteMask = 0xBF;
        static constexpr UTF32 byteMark = 0x80;
        const UTF16* oldSource = source; /* In case we have to back up because of target overflow. */
        UTF32 ch = *source++;
        /* If we have a surrogate pair, convert to UTF32 first. */
        if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_HIGH_END)
        {
            /* If the 16 bits following the high surrogate are in the source buffer... */
            if (source < sourceEnd)
            {
                const UTF32 ch2 = *source;
                /* If it's a low surrogate, convert to UTF32. */
                if (ch2 >= UNI_SUR_LOW_START && ch2 <= UNI_SUR_LOW_END)
                {
                    ch = ((ch - UNI_SUR_HIGH_START) << halfShift) + (ch2 - UNI_SUR_LOW_START) + halfBase;
                    ++source;
                }
                else if (flags == ConversionFlags::strictConversion)
                {             /* it's an unpaired high surrogate */
                    --source; /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
            }
            else
            {             /* We don't have the 16 bits following the high surrogate. */
                --source; /* return to the high surrogate */
                result = ConversionResult::sourceExhausted;
                break;
            }
        }
        else if (flags == ConversionFlags::strictConversion)
        {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_LOW_START && ch <= UNI_SUR_LOW_END)
            {
                --source; /* return to the illegal value itself */
                result = ConversionResult::sourceIllegal;
                break;
            }
        }
        /* Figure out how many bytes the result will require */
        if (ch < 0x80)
        {
            bytesToWrite = 1;
        }
        else if (ch < 0x800)
        {
            bytesToWrite = 2;
        }
        else if (ch < 0x10000)
        {
            bytesToWrite = 3;
        }
        else if (ch < 0x110000)
        {
            bytesToWrite = 4;
        }
        else
        {
            bytesToWrite = 3;
            ch = UNI_REPLACEMENT_CHAR;
        }

        target += bytesToWrite;
        if (target > targetEnd)
        {
            source = oldSource; /* Back up source pointer! */
            target -= bytesToWrite;
            result = ConversionResult::targetExhausted;
            break;
        }
        switch (bytesToWrite)
        { /* note: everything falls through. */
        case 4:
            *--target = (ch | byteMark) & byteMask;
            ch >>= 6;
            [[fallthrough]];
        case 3:
            *--target = (ch | byteMark) & byteMask;
            ch >>= 6;
            [[fallthrough]];
        case 2:
            *--target = (ch | byteMark) & byteMask;
            ch >>= 6;
            [[fallthrough]];
        case 1:
            *--target = static_cast<UTF8>(ch | firstByteMark[bytesToWrite]);
            break;
        default:;
        }
        target += bytesToWrite;
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}